

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void idct16_w4_sse2(__m128i *input,__m128i *output)

{
  __m128i alVar1;
  __m128i alVar2;
  __m128i alVar3;
  undefined1 auVar4 [16];
  __m128i _in1;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar9 [16];
  __m128i _in1_4;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar40 [16];
  __m128i _in1_2;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar47 [16];
  undefined1 auVar51 [16];
  __m128i _in0;
  undefined1 auVar52 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar68 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  __m128i _in0_1;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  __m128i _in1_1;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  __m128i _in0_2;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  __m128i local_138;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar32 [16];
  undefined1 auVar37 [16];
  undefined1 auVar33 [16];
  undefined1 auVar38 [16];
  undefined1 auVar34 [16];
  undefined1 auVar39 [16];
  undefined1 auVar44 [16];
  undefined1 auVar48 [16];
  undefined1 auVar45 [16];
  undefined1 auVar49 [16];
  undefined1 auVar46 [16];
  undefined1 auVar50 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  
  alVar1 = input[1];
  alVar2 = input[2];
  auVar71._0_12_ = alVar1._0_12_;
  auVar71._12_2_ = alVar1[0]._6_2_;
  auVar71._14_2_ = *(undefined2 *)((long)input[0xf] + 6);
  auVar70._12_4_ = auVar71._12_4_;
  auVar70._0_10_ = alVar1._0_10_;
  auVar70._10_2_ = *(undefined2 *)((long)input[0xf] + 4);
  auVar69._10_6_ = auVar70._10_6_;
  auVar69._0_8_ = alVar1[0];
  auVar69._8_2_ = alVar1[0]._4_2_;
  auVar68._8_8_ = auVar69._8_8_;
  auVar68._6_2_ = *(undefined2 *)((long)input[0xf] + 2);
  auVar68._4_2_ = alVar1[0]._2_2_;
  auVar68._0_2_ = (undefined2)alVar1[0];
  auVar68._2_2_ = (short)input[0xf][0];
  alVar1 = input[10];
  auVar27._8_4_ = 0xf0140191;
  auVar27._0_8_ = 0xf0140191f0140191;
  auVar27._12_4_ = 0xf0140191;
  auVar28 = pmaddwd(auVar27,auVar68);
  auVar30._8_4_ = 0x1910fec;
  auVar30._0_8_ = 0x1910fec01910fec;
  auVar30._12_4_ = 0x1910fec;
  auVar4 = pmaddwd(auVar30,auVar68);
  alVar3 = input[9];
  auVar85._0_12_ = alVar3._0_12_;
  auVar85._12_2_ = alVar3[0]._6_2_;
  auVar85._14_2_ = *(undefined2 *)((long)input[7] + 6);
  auVar79._12_4_ = auVar85._12_4_;
  auVar79._0_10_ = alVar3._0_10_;
  auVar79._10_2_ = *(undefined2 *)((long)input[7] + 4);
  auVar73._10_6_ = auVar79._10_6_;
  auVar73._0_8_ = alVar3[0];
  auVar73._8_2_ = alVar3[0]._4_2_;
  auVar75._8_8_ = auVar73._8_8_;
  auVar75._6_2_ = *(undefined2 *)((long)input[7] + 2);
  auVar75._4_2_ = alVar3[0]._2_2_;
  auVar75._0_2_ = (undefined2)alVar3[0];
  auVar75._2_2_ = (short)input[7][0];
  auVar72._8_4_ = 0xf5da0c5e;
  auVar72._0_8_ = 0xf5da0c5ef5da0c5e;
  auVar72._12_4_ = 0xf5da0c5e;
  auVar73 = pmaddwd(auVar72,auVar75);
  auVar10._8_4_ = 0xc5e0a26;
  auVar10._0_8_ = 0xc5e0a260c5e0a26;
  auVar10._12_4_ = 0xc5e0a26;
  auVar11 = pmaddwd(auVar10,auVar75);
  alVar3 = input[5];
  auVar55._0_12_ = alVar3._0_12_;
  auVar55._12_2_ = alVar3[0]._6_2_;
  auVar55._14_2_ = *(undefined2 *)((long)input[0xb] + 6);
  auVar54._12_4_ = auVar55._12_4_;
  auVar54._0_10_ = alVar3._0_10_;
  auVar54._10_2_ = *(undefined2 *)((long)input[0xb] + 4);
  auVar53._10_6_ = auVar54._10_6_;
  auVar53._0_8_ = alVar3[0];
  auVar53._8_2_ = alVar3[0]._4_2_;
  auVar52._8_8_ = auVar53._8_8_;
  auVar52._6_2_ = *(undefined2 *)((long)input[0xb] + 2);
  auVar52._4_2_ = alVar3[0]._2_2_;
  auVar52._0_2_ = (undefined2)alVar3[0];
  auVar52._2_2_ = (short)input[0xb][0];
  auVar59._8_4_ = 0xf1e4078b;
  auVar59._0_8_ = 0xf1e4078bf1e4078b;
  auVar59._12_4_ = 0xf1e4078b;
  auVar5 = pmaddwd(auVar59,auVar52);
  auVar84._8_4_ = 0x78b0e1c;
  auVar84._0_8_ = 0x78b0e1c078b0e1c;
  auVar84._12_4_ = 0x78b0e1c;
  auVar85 = pmaddwd(auVar84,auVar52);
  alVar3 = input[0xd];
  auVar67._0_12_ = alVar3._0_12_;
  auVar67._12_2_ = alVar3[0]._6_2_;
  auVar67._14_2_ = *(undefined2 *)((long)input[3] + 6);
  auVar66._12_4_ = auVar67._12_4_;
  auVar66._0_10_ = alVar3._0_10_;
  auVar66._10_2_ = *(undefined2 *)((long)input[3] + 4);
  auVar65._10_6_ = auVar66._10_6_;
  auVar65._0_8_ = alVar3[0];
  auVar65._8_2_ = alVar3[0]._4_2_;
  auVar64._8_8_ = auVar65._8_8_;
  auVar64._6_2_ = *(undefined2 *)((long)input[3] + 2);
  auVar64._4_2_ = alVar3[0]._2_2_;
  auVar64._0_2_ = (undefined2)alVar3[0];
  auVar64._2_2_ = (short)input[3][0];
  auVar56._8_4_ = 0xfb5b0f50;
  auVar56._0_8_ = 0xfb5b0f50fb5b0f50;
  auVar56._12_4_ = 0xfb5b0f50;
  auVar57 = pmaddwd(auVar56,auVar64);
  auVar78._8_4_ = 0xf5004a5;
  auVar78._0_8_ = 0xf5004a50f5004a5;
  auVar78._12_4_ = 0xf5004a5;
  auVar79 = pmaddwd(auVar78,auVar64);
  auVar46._0_12_ = alVar2._0_12_;
  auVar46._12_2_ = alVar2[0]._6_2_;
  auVar46._14_2_ = *(undefined2 *)((long)input[0xe] + 6);
  auVar45._12_4_ = auVar46._12_4_;
  auVar45._0_10_ = alVar2._0_10_;
  auVar45._10_2_ = *(undefined2 *)((long)input[0xe] + 4);
  auVar44._10_6_ = auVar45._10_6_;
  auVar44._0_8_ = alVar2[0];
  auVar44._8_2_ = alVar2[0]._4_2_;
  auVar43._8_8_ = auVar44._8_8_;
  auVar43._6_2_ = *(undefined2 *)((long)input[0xe] + 2);
  auVar43._4_2_ = alVar2[0]._2_2_;
  auVar43._0_2_ = (undefined2)alVar2[0];
  auVar43._2_2_ = (short)input[0xe][0];
  auVar25._0_12_ = alVar1._0_12_;
  auVar25._12_2_ = alVar1[0]._6_2_;
  auVar25._14_2_ = *(undefined2 *)((long)input[6] + 6);
  auVar24._12_4_ = auVar25._12_4_;
  auVar24._0_10_ = alVar1._0_10_;
  auVar24._10_2_ = *(undefined2 *)((long)input[6] + 4);
  auVar23._10_6_ = auVar24._10_6_;
  auVar23._0_8_ = alVar1[0];
  auVar23._8_2_ = alVar1[0]._4_2_;
  auVar22._8_8_ = auVar23._8_8_;
  auVar22._6_2_ = *(undefined2 *)((long)input[6] + 2);
  auVar22._4_2_ = alVar1[0]._2_2_;
  auVar22._0_2_ = (undefined2)alVar1[0];
  auVar22._2_2_ = (short)input[6][0];
  auVar14._8_4_ = 0xf04f031f;
  auVar14._0_8_ = 0xf04f031ff04f031f;
  auVar14._12_4_ = 0xf04f031f;
  auVar15 = pmaddwd(auVar14,auVar43);
  auVar90._8_4_ = 0x31f0fb1;
  auVar90._0_8_ = 0x31f0fb1031f0fb1;
  auVar90._12_4_ = 0x31f0fb1;
  auVar91 = pmaddwd(auVar90,auVar43);
  auVar29._0_4_ = auVar28._0_4_ + 0x800 >> 0xc;
  auVar29._4_4_ = auVar28._4_4_ + 0x800 >> 0xc;
  auVar29._8_4_ = auVar28._8_4_ + 0x800 >> 0xc;
  auVar29._12_4_ = auVar28._12_4_ + 0x800 >> 0xc;
  auVar30 = packssdw(auVar29,auVar29);
  auVar74._0_4_ = auVar73._0_4_ + 0x800 >> 0xc;
  auVar74._4_4_ = auVar73._4_4_ + 0x800 >> 0xc;
  auVar74._8_4_ = auVar73._8_4_ + 0x800 >> 0xc;
  auVar74._12_4_ = auVar73._12_4_ + 0x800 >> 0xc;
  auVar75 = packssdw(auVar74,auVar74);
  auVar81._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar81._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar81._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar81._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  auVar86._0_4_ = auVar85._0_4_ + 0x800 >> 0xc;
  auVar86._4_4_ = auVar85._4_4_ + 0x800 >> 0xc;
  auVar86._8_4_ = auVar85._8_4_ + 0x800 >> 0xc;
  auVar86._12_4_ = auVar85._12_4_ + 0x800 >> 0xc;
  auVar5 = packssdw(auVar81,auVar81);
  auVar87 = packssdw(auVar86,auVar86);
  auVar58._0_4_ = auVar57._0_4_ + 0x800 >> 0xc;
  auVar58._4_4_ = auVar57._4_4_ + 0x800 >> 0xc;
  auVar58._8_4_ = auVar57._8_4_ + 0x800 >> 0xc;
  auVar58._12_4_ = auVar57._12_4_ + 0x800 >> 0xc;
  auVar80._0_4_ = auVar79._0_4_ + 0x800 >> 0xc;
  auVar80._4_4_ = auVar79._4_4_ + 0x800 >> 0xc;
  auVar80._8_4_ = auVar79._8_4_ + 0x800 >> 0xc;
  auVar80._12_4_ = auVar79._12_4_ + 0x800 >> 0xc;
  auVar28 = packssdw(auVar58,auVar58);
  auVar81 = packssdw(auVar80,auVar80);
  auVar60._8_4_ = 0xf71c0d4e;
  auVar60._0_8_ = 0xf71c0d4ef71c0d4e;
  auVar60._12_4_ = 0xf71c0d4e;
  auVar85 = pmaddwd(auVar60,auVar22);
  auVar41._8_4_ = 0xd4e08e4;
  auVar41._0_8_ = 0xd4e08e40d4e08e4;
  auVar41._12_4_ = 0xd4e08e4;
  auVar73 = pmaddwd(auVar41,auVar22);
  auVar57 = paddsw(auVar30,auVar75);
  auVar75 = psubsw(auVar30,auVar75);
  auVar79 = psubsw(auVar28,auVar5);
  auVar59 = paddsw(auVar28,auVar5);
  auVar30 = paddsw(auVar81,auVar87);
  auVar81 = psubsw(auVar81,auVar87);
  auVar28._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar28._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar28._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar28._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar4 = packssdw(auVar28,auVar28);
  auVar12._0_4_ = auVar11._0_4_ + 0x800 >> 0xc;
  auVar12._4_4_ = auVar11._4_4_ + 0x800 >> 0xc;
  auVar12._8_4_ = auVar11._8_4_ + 0x800 >> 0xc;
  auVar12._12_4_ = auVar11._12_4_ + 0x800 >> 0xc;
  auVar5 = packssdw(auVar12,auVar12);
  auVar50._0_12_ = auVar79._0_12_;
  auVar50._12_2_ = auVar79._6_2_;
  auVar50._14_2_ = auVar81._6_2_;
  auVar49._12_4_ = auVar50._12_4_;
  auVar49._0_10_ = auVar79._0_10_;
  auVar49._10_2_ = auVar81._4_2_;
  auVar48._10_6_ = auVar49._10_6_;
  auVar48._0_8_ = auVar79._0_8_;
  auVar48._8_2_ = auVar79._4_2_;
  auVar47._8_8_ = auVar48._8_8_;
  auVar47._6_2_ = auVar81._2_2_;
  auVar47._4_2_ = auVar79._2_2_;
  auVar47._0_2_ = auVar79._0_2_;
  auVar47._2_2_ = auVar81._0_2_;
  auVar28 = psubsw(auVar4,auVar5);
  auVar34._0_12_ = auVar75._0_12_;
  auVar34._12_2_ = auVar75._6_2_;
  auVar34._14_2_ = auVar28._6_2_;
  auVar33._12_4_ = auVar34._12_4_;
  auVar33._0_10_ = auVar75._0_10_;
  auVar33._10_2_ = auVar28._4_2_;
  auVar32._10_6_ = auVar33._10_6_;
  auVar32._0_8_ = auVar75._0_8_;
  auVar32._8_2_ = auVar75._4_2_;
  auVar31._8_8_ = auVar32._8_8_;
  auVar31._6_2_ = auVar28._2_2_;
  auVar31._4_2_ = auVar75._2_2_;
  auVar31._0_2_ = auVar75._0_2_;
  auVar31._2_2_ = auVar28._0_2_;
  auVar75 = paddsw(auVar5,auVar4);
  auVar16._0_4_ = auVar15._0_4_ + 0x800 >> 0xc;
  auVar16._4_4_ = auVar15._4_4_ + 0x800 >> 0xc;
  auVar16._8_4_ = auVar15._8_4_ + 0x800 >> 0xc;
  auVar16._12_4_ = auVar15._12_4_ + 0x800 >> 0xc;
  auVar92._0_4_ = auVar91._0_4_ + 0x800 >> 0xc;
  auVar92._4_4_ = auVar91._4_4_ + 0x800 >> 0xc;
  auVar92._8_4_ = auVar91._8_4_ + 0x800 >> 0xc;
  auVar92._12_4_ = auVar91._12_4_ + 0x800 >> 0xc;
  auVar5 = packssdw(auVar16,auVar16);
  auVar79 = packssdw(auVar92,auVar92);
  auVar61._0_4_ = auVar85._0_4_ + 0x800 >> 0xc;
  auVar61._4_4_ = auVar85._4_4_ + 0x800 >> 0xc;
  auVar61._8_4_ = auVar85._8_4_ + 0x800 >> 0xc;
  auVar61._12_4_ = auVar85._12_4_ + 0x800 >> 0xc;
  auVar42._0_4_ = auVar73._0_4_ + 0x800 >> 0xc;
  auVar42._4_4_ = auVar73._4_4_ + 0x800 >> 0xc;
  auVar42._8_4_ = auVar73._8_4_ + 0x800 >> 0xc;
  auVar42._12_4_ = auVar73._12_4_ + 0x800 >> 0xc;
  auVar73 = packssdw(auVar61,auVar61);
  auVar15 = packssdw(auVar42,auVar42);
  auVar88._8_4_ = 0xf138061f;
  auVar88._0_8_ = 0xf138061ff138061f;
  auVar88._12_4_ = 0xf138061f;
  auVar4._2_2_ = (short)input[0xc][0];
  auVar4._0_2_ = (short)input[4][0];
  auVar4._4_2_ = *(undefined2 *)((long)input[4] + 2);
  auVar4._6_2_ = *(undefined2 *)((long)input[0xc] + 2);
  auVar4._8_2_ = *(undefined2 *)((long)input[4] + 4);
  auVar4._10_2_ = *(undefined2 *)((long)input[0xc] + 4);
  auVar4._12_2_ = *(undefined2 *)((long)input[4] + 6);
  auVar4._14_2_ = *(undefined2 *)((long)input[0xc] + 6);
  auVar91 = pmaddwd(auVar88,auVar4);
  auVar11._8_4_ = 0x61f0ec8;
  auVar11._0_8_ = 0x61f0ec8061f0ec8;
  auVar11._12_4_ = 0x61f0ec8;
  auVar4 = pmaddwd(auVar11,auVar4);
  auVar28 = paddsw(auVar5,auVar73);
  auVar11 = psubsw(auVar5,auVar73);
  auVar5 = psubsw(auVar79,auVar15);
  auVar20._0_12_ = auVar11._0_12_;
  auVar20._12_2_ = auVar11._6_2_;
  auVar20._14_2_ = auVar5._6_2_;
  auVar19._12_4_ = auVar20._12_4_;
  auVar19._0_10_ = auVar11._0_10_;
  auVar19._10_2_ = auVar5._4_2_;
  auVar18._10_6_ = auVar19._10_6_;
  auVar18._0_8_ = auVar11._0_8_;
  auVar18._8_2_ = auVar11._4_2_;
  auVar17._8_8_ = auVar18._8_8_;
  auVar17._6_2_ = auVar5._2_2_;
  auVar17._4_2_ = auVar11._2_2_;
  auVar17._0_2_ = auVar11._0_2_;
  auVar17._2_2_ = auVar5._0_2_;
  auVar79 = paddsw(auVar15,auVar79);
  auVar62._8_4_ = 0x61ff138;
  auVar62._0_8_ = 0x61ff138061ff138;
  auVar62._12_4_ = 0x61ff138;
  auVar82._8_4_ = 0xec8061f;
  auVar82._0_8_ = 0xec8061f0ec8061f;
  auVar82._12_4_ = 0xec8061f;
  auVar87 = pmaddwd(auVar82,auVar31);
  auVar73 = pmaddwd(auVar31,auVar62);
  auVar93._8_4_ = 0xf138f9e1;
  auVar93._0_8_ = 0xf138f9e1f138f9e1;
  auVar93._12_4_ = 0xf138f9e1;
  auVar94 = pmaddwd(auVar93,auVar47);
  auVar85 = pmaddwd(auVar47,auVar62);
  auVar63._8_4_ = 0xb500b50;
  auVar63._0_8_ = 0xb500b500b500b50;
  auVar63._12_4_ = 0xb500b50;
  auVar76._8_4_ = 0xf4b00b50;
  auVar76._0_8_ = 0xf4b00b50f4b00b50;
  auVar76._12_4_ = 0xf4b00b50;
  auVar5._2_2_ = (short)input[8][0];
  auVar5._0_2_ = (short)(*input)[0];
  auVar5._4_2_ = *(undefined2 *)((long)*input + 2);
  auVar5._6_2_ = *(undefined2 *)((long)input[8] + 2);
  auVar5._8_2_ = *(undefined2 *)((long)*input + 4);
  auVar5._10_2_ = *(undefined2 *)((long)input[8] + 4);
  auVar5._12_2_ = *(undefined2 *)((long)*input + 6);
  auVar5._14_2_ = *(undefined2 *)((long)input[8] + 6);
  auVar81 = pmaddwd(auVar76,auVar5);
  auVar5 = pmaddwd(auVar5,auVar63);
  auVar26._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar26._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar26._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar26._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  auVar11 = packssdw(auVar26,auVar26);
  auVar15._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar15._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar15._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar15._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar4 = packssdw(auVar15,auVar15);
  auVar5 = paddsw(auVar11,auVar4);
  auVar15 = psubsw(auVar11,auVar4);
  auVar77._0_4_ = auVar81._0_4_ + 0x800 >> 0xc;
  auVar77._4_4_ = auVar81._4_4_ + 0x800 >> 0xc;
  auVar77._8_4_ = auVar81._8_4_ + 0x800 >> 0xc;
  auVar77._12_4_ = auVar81._12_4_ + 0x800 >> 0xc;
  auVar11 = packssdw(auVar77,auVar77);
  auVar89._0_4_ = auVar91._0_4_ + 0x800 >> 0xc;
  auVar89._4_4_ = auVar91._4_4_ + 0x800 >> 0xc;
  auVar89._8_4_ = auVar91._8_4_ + 0x800 >> 0xc;
  auVar89._12_4_ = auVar91._12_4_ + 0x800 >> 0xc;
  auVar81 = packssdw(auVar89,auVar89);
  auVar4 = paddsw(auVar11,auVar81);
  auVar81 = psubsw(auVar11,auVar81);
  local_b8 = paddsw(auVar57,auVar59);
  auVar11 = psubsw(auVar57,auVar59);
  auVar35._0_4_ = auVar73._0_4_ + 0x800 >> 0xc;
  auVar35._4_4_ = auVar73._4_4_ + 0x800 >> 0xc;
  auVar35._8_4_ = auVar73._8_4_ + 0x800 >> 0xc;
  auVar35._12_4_ = auVar73._12_4_ + 0x800 >> 0xc;
  auVar57 = packssdw(auVar35,auVar35);
  auVar95._0_4_ = auVar94._0_4_ + 0x800 >> 0xc;
  auVar95._4_4_ = auVar94._4_4_ + 0x800 >> 0xc;
  auVar95._8_4_ = auVar94._8_4_ + 0x800 >> 0xc;
  auVar95._12_4_ = auVar94._12_4_ + 0x800 >> 0xc;
  auVar73 = packssdw(auVar95,auVar95);
  local_a8 = paddsw(auVar57,auVar73);
  auVar57 = psubsw(auVar57,auVar73);
  auVar73 = psubsw(auVar75,auVar30);
  auVar8._0_12_ = auVar11._0_12_;
  auVar8._12_2_ = auVar11._6_2_;
  auVar8._14_2_ = auVar73._6_2_;
  auVar7._12_4_ = auVar8._12_4_;
  auVar7._0_10_ = auVar11._0_10_;
  auVar7._10_2_ = auVar73._4_2_;
  auVar6._10_6_ = auVar7._10_6_;
  auVar6._0_8_ = auVar11._0_8_;
  auVar6._8_2_ = auVar11._4_2_;
  auVar94._8_8_ = auVar6._8_8_;
  auVar94._6_2_ = auVar73._2_2_;
  auVar94._4_2_ = auVar11._2_2_;
  auVar94._0_2_ = auVar11._0_2_;
  auVar94._2_2_ = auVar73._0_2_;
  local_48 = paddsw(auVar75,auVar30);
  auVar83._0_4_ = auVar87._0_4_ + 0x800 >> 0xc;
  auVar83._4_4_ = auVar87._4_4_ + 0x800 >> 0xc;
  auVar83._8_4_ = auVar87._8_4_ + 0x800 >> 0xc;
  auVar83._12_4_ = auVar87._12_4_ + 0x800 >> 0xc;
  auVar75 = packssdw(auVar83,auVar83);
  auVar51._0_4_ = auVar85._0_4_ + 0x800 >> 0xc;
  auVar51._4_4_ = auVar85._4_4_ + 0x800 >> 0xc;
  auVar51._8_4_ = auVar85._8_4_ + 0x800 >> 0xc;
  auVar51._12_4_ = auVar85._12_4_ + 0x800 >> 0xc;
  auVar11 = packssdw(auVar51,auVar51);
  auVar30 = psubsw(auVar75,auVar11);
  auVar39._0_12_ = auVar57._0_12_;
  auVar39._12_2_ = auVar57._6_2_;
  auVar39._14_2_ = auVar30._6_2_;
  auVar38._12_4_ = auVar39._12_4_;
  auVar38._0_10_ = auVar57._0_10_;
  auVar38._10_2_ = auVar30._4_2_;
  auVar37._10_6_ = auVar38._10_6_;
  auVar37._0_8_ = auVar57._0_8_;
  auVar37._8_2_ = auVar57._4_2_;
  auVar36._8_8_ = auVar37._8_8_;
  auVar36._6_2_ = auVar30._2_2_;
  auVar36._4_2_ = auVar57._2_2_;
  auVar36._0_2_ = auVar57._0_2_;
  auVar36._2_2_ = auVar30._0_2_;
  local_58 = paddsw(auVar11,auVar75);
  local_138 = (__m128i)paddsw(auVar5,auVar79);
  local_c8 = psubsw(auVar5,auVar79);
  auVar5 = pmaddwd(auVar17,auVar63);
  auVar21._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar21._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar21._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar21._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  auVar5 = packssdw(auVar21,auVar21);
  local_128 = paddsw(auVar4,auVar5);
  local_d8 = psubsw(auVar4,auVar5);
  auVar87._8_4_ = 0xb50f4b0;
  auVar87._0_8_ = 0xb50f4b00b50f4b0;
  auVar87._12_4_ = 0xb50f4b0;
  auVar4 = pmaddwd(auVar17,auVar87);
  auVar13._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar13._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar13._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar13._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar4 = packssdw(auVar13,auVar13);
  local_118 = paddsw(auVar81,auVar4);
  local_e8 = psubsw(auVar81,auVar4);
  local_108 = paddsw(auVar15,auVar28);
  local_f8 = psubsw(auVar15,auVar28);
  auVar4 = pmaddwd(auVar36,auVar87);
  auVar57._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar57._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar57._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar57._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  local_98 = packssdw(auVar57,auVar57);
  auVar4 = pmaddwd(auVar36,auVar63);
  auVar40._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar40._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar40._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar40._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  local_68 = packssdw(auVar40,auVar40);
  auVar4 = pmaddwd(auVar87,auVar94);
  auVar5 = pmaddwd(auVar94,auVar63);
  auVar91._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar91._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar91._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar91._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  local_88 = packssdw(auVar91,auVar91);
  auVar9._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar9._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar9._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar9._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  local_78 = packssdw(auVar9,auVar9);
  idct16_stage7_sse2(output,&local_138);
  return;
}

Assistant:

static void idct16_w4_sse2(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m128i cospi_p60_m04 = pair_set_epi16(cospi[60], -cospi[4]);
  const __m128i cospi_p04_p60 = pair_set_epi16(cospi[4], cospi[60]);
  const __m128i cospi_p28_m36 = pair_set_epi16(cospi[28], -cospi[36]);
  const __m128i cospi_p36_p28 = pair_set_epi16(cospi[36], cospi[28]);
  const __m128i cospi_p44_m20 = pair_set_epi16(cospi[44], -cospi[20]);
  const __m128i cospi_p20_p44 = pair_set_epi16(cospi[20], cospi[44]);
  const __m128i cospi_p12_m52 = pair_set_epi16(cospi[12], -cospi[52]);
  const __m128i cospi_p52_p12 = pair_set_epi16(cospi[52], cospi[12]);
  const __m128i cospi_p56_m08 = pair_set_epi16(cospi[56], -cospi[8]);
  const __m128i cospi_p08_p56 = pair_set_epi16(cospi[8], cospi[56]);
  const __m128i cospi_p24_m40 = pair_set_epi16(cospi[24], -cospi[40]);
  const __m128i cospi_p40_p24 = pair_set_epi16(cospi[40], cospi[24]);
  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);
  const __m128i cospi_p48_m16 = pair_set_epi16(cospi[48], -cospi[16]);
  const __m128i cospi_p16_p48 = pair_set_epi16(cospi[16], cospi[48]);
  const __m128i cospi_m16_p48 = pair_set_epi16(-cospi[16], cospi[48]);
  const __m128i cospi_p48_p16 = pair_set_epi16(cospi[48], cospi[16]);
  const __m128i cospi_m48_m16 = pair_set_epi16(-cospi[48], -cospi[16]);
  const __m128i cospi_m32_p32 = pair_set_epi16(-cospi[32], cospi[32]);

  // stage 1
  __m128i x[16];
  x[0] = input[0];
  x[1] = input[8];
  x[2] = input[4];
  x[3] = input[12];
  x[4] = input[2];
  x[5] = input[10];
  x[6] = input[6];
  x[7] = input[14];
  x[8] = input[1];
  x[9] = input[9];
  x[10] = input[5];
  x[11] = input[13];
  x[12] = input[3];
  x[13] = input[11];
  x[14] = input[7];
  x[15] = input[15];

  // stage 2
  btf_16_4p_sse2(cospi_p60_m04, cospi_p04_p60, x[8], x[15], x[8], x[15]);
  btf_16_4p_sse2(cospi_p28_m36, cospi_p36_p28, x[9], x[14], x[9], x[14]);
  btf_16_4p_sse2(cospi_p44_m20, cospi_p20_p44, x[10], x[13], x[10], x[13]);
  btf_16_4p_sse2(cospi_p12_m52, cospi_p52_p12, x[11], x[12], x[11], x[12]);

  // stage 3
  btf_16_4p_sse2(cospi_p56_m08, cospi_p08_p56, x[4], x[7], x[4], x[7]);
  btf_16_4p_sse2(cospi_p24_m40, cospi_p40_p24, x[5], x[6], x[5], x[6]);
  btf_16_adds_subs_sse2(x[8], x[9]);
  btf_16_subs_adds_sse2(x[11], x[10]);
  btf_16_adds_subs_sse2(x[12], x[13]);
  btf_16_subs_adds_sse2(x[15], x[14]);

  // stage 4
  btf_16_4p_sse2(cospi_p32_p32, cospi_p32_m32, x[0], x[1], x[0], x[1]);
  btf_16_4p_sse2(cospi_p48_m16, cospi_p16_p48, x[2], x[3], x[2], x[3]);
  btf_16_adds_subs_sse2(x[4], x[5]);
  btf_16_subs_adds_sse2(x[7], x[6]);
  btf_16_4p_sse2(cospi_m16_p48, cospi_p48_p16, x[9], x[14], x[9], x[14]);
  btf_16_4p_sse2(cospi_m48_m16, cospi_m16_p48, x[10], x[13], x[10], x[13]);

  // stage 5
  btf_16_adds_subs_sse2(x[0], x[3]);
  btf_16_adds_subs_sse2(x[1], x[2]);
  btf_16_4p_sse2(cospi_m32_p32, cospi_p32_p32, x[5], x[6], x[5], x[6]);
  btf_16_adds_subs_sse2(x[8], x[11]);
  btf_16_adds_subs_sse2(x[9], x[10]);
  btf_16_subs_adds_sse2(x[15], x[12]);
  btf_16_subs_adds_sse2(x[14], x[13]);

  // stage 6
  btf_16_adds_subs_sse2(x[0], x[7]);
  btf_16_adds_subs_sse2(x[1], x[6]);
  btf_16_adds_subs_sse2(x[2], x[5]);
  btf_16_adds_subs_sse2(x[3], x[4]);
  btf_16_4p_sse2(cospi_m32_p32, cospi_p32_p32, x[10], x[13], x[10], x[13]);
  btf_16_4p_sse2(cospi_m32_p32, cospi_p32_p32, x[11], x[12], x[11], x[12]);

  // stage 7
  idct16_stage7_sse2(output, x);
}